

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O0

void * pool_malloc(pool_t pool_id,int size)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  undefined8 *elem;
  void *pvVar4;
  pool_node_t *pppVar5;
  int in_ESI;
  ushort in_DI;
  void *ptr;
  pool_node_t newnode;
  pool_info_t pool;
  int num_blocks;
  int i;
  uint local_34;
  pool_info_t id;
  int local_14;
  
  id = pools[in_DI];
  uVar2 = in_ESI + 7U & 0xfffffff8;
  iVar3 = prf_array_count((void *)0x116161);
  local_14 = 0;
  while( true ) {
    if (iVar3 <= local_14) {
      elem = (undefined8 *)malloc(0x10);
      local_34 = uVar2;
      if ((int)uVar2 <= id->block_size) {
        local_34 = id->block_size;
      }
      *(uint *)(elem + 1) = local_34;
      *(uint *)((long)elem + 0xc) = uVar2;
      pvVar4 = malloc((long)*(int *)(elem + 1));
      *elem = pvVar4;
      pppVar5 = (pool_node_t *)prf_array_append_ptr(id,elem);
      id->blocks = pppVar5;
      return (void *)*elem;
    }
    if ((int)uVar2 <= id->blocks[local_14]->data_size - id->blocks[local_14]->data_pos) break;
    local_14 = local_14 + 1;
  }
  puVar1 = id->blocks[local_14]->data;
  iVar3 = id->blocks[local_14]->data_pos;
  id->blocks[local_14]->data_pos = uVar2 + id->blocks[local_14]->data_pos;
  return puVar1 + iVar3;
}

Assistant:

void *
pool_malloc(
    pool_t pool_id,
    int size )
{
    int i, num_blocks;
    pool_info_t pool;
    pool_node_t newnode;
    void * ptr;

    assert( (pool_id > 0) && (pool_id < prf_array_count( pools )) );
    assert( pools[ pool_id ] != NULL );

    pool = pools[ pool_id ];
    size = (size + 7) & (~7); /* we're always aligning on eight bytes */

    num_blocks = prf_array_count( pool->blocks );
    for ( i = 0; i < num_blocks; i++ ) {
        if ( size <= (pool->blocks[i]->data_size -
                      pool->blocks[i]->data_pos) ) {
            ptr = pool->blocks[i]->data + pool->blocks[i]->data_pos;
            pool->blocks[i]->data_pos += size;
            return ptr;
        }
    }
    /* need new block */

    newnode = (pool_node_t)malloc( sizeof( struct pool_node_s ) );
    assert( newnode != NULL );
    newnode->data_size = PRF_MAX( pool->block_size, size );
    newnode->data_pos = size;
    newnode->data = (uint8_t *)malloc( newnode->data_size );
    assert( newnode->data != NULL );
    pool->blocks = (pool_node_t *)prf_array_append_ptr(pool->blocks, newnode );
    return newnode->data;
}